

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.hpp
# Opt level: O0

bool operator==(mat4f *a,mat4f *b)

{
  float fVar1;
  float *pfVar2;
  mat4f *in_RSI;
  mat4f *in_RDI;
  bool local_11;
  
  pfVar2 = mat4f::operator[](in_RDI,0);
  fVar1 = *pfVar2;
  pfVar2 = mat4f::operator[](in_RSI,0);
  local_11 = false;
  if ((fVar1 == *pfVar2) && (!NAN(fVar1) && !NAN(*pfVar2))) {
    pfVar2 = mat4f::operator[](in_RDI,0);
    fVar1 = pfVar2[1];
    pfVar2 = mat4f::operator[](in_RSI,0);
    local_11 = false;
    if ((fVar1 == pfVar2[1]) && (!NAN(fVar1) && !NAN(pfVar2[1]))) {
      pfVar2 = mat4f::operator[](in_RDI,0);
      fVar1 = pfVar2[2];
      pfVar2 = mat4f::operator[](in_RSI,0);
      local_11 = false;
      if ((fVar1 == pfVar2[2]) && (!NAN(fVar1) && !NAN(pfVar2[2]))) {
        pfVar2 = mat4f::operator[](in_RDI,0);
        fVar1 = pfVar2[3];
        pfVar2 = mat4f::operator[](in_RSI,0);
        local_11 = false;
        if ((fVar1 == pfVar2[3]) && (!NAN(fVar1) && !NAN(pfVar2[3]))) {
          pfVar2 = mat4f::operator[](in_RDI,1);
          fVar1 = *pfVar2;
          pfVar2 = mat4f::operator[](in_RSI,1);
          local_11 = false;
          if ((fVar1 == *pfVar2) && (!NAN(fVar1) && !NAN(*pfVar2))) {
            pfVar2 = mat4f::operator[](in_RDI,1);
            fVar1 = pfVar2[1];
            pfVar2 = mat4f::operator[](in_RSI,1);
            local_11 = false;
            if ((fVar1 == pfVar2[1]) && (!NAN(fVar1) && !NAN(pfVar2[1]))) {
              pfVar2 = mat4f::operator[](in_RDI,1);
              fVar1 = pfVar2[2];
              pfVar2 = mat4f::operator[](in_RSI,1);
              local_11 = false;
              if ((fVar1 == pfVar2[2]) && (!NAN(fVar1) && !NAN(pfVar2[2]))) {
                pfVar2 = mat4f::operator[](in_RDI,1);
                fVar1 = pfVar2[3];
                pfVar2 = mat4f::operator[](in_RSI,1);
                local_11 = false;
                if ((fVar1 == pfVar2[3]) && (!NAN(fVar1) && !NAN(pfVar2[3]))) {
                  pfVar2 = mat4f::operator[](in_RDI,2);
                  fVar1 = *pfVar2;
                  pfVar2 = mat4f::operator[](in_RSI,2);
                  local_11 = false;
                  if ((fVar1 == *pfVar2) && (!NAN(fVar1) && !NAN(*pfVar2))) {
                    pfVar2 = mat4f::operator[](in_RDI,2);
                    fVar1 = pfVar2[1];
                    pfVar2 = mat4f::operator[](in_RSI,2);
                    local_11 = false;
                    if ((fVar1 == pfVar2[1]) && (!NAN(fVar1) && !NAN(pfVar2[1]))) {
                      pfVar2 = mat4f::operator[](in_RDI,2);
                      fVar1 = pfVar2[2];
                      pfVar2 = mat4f::operator[](in_RSI,2);
                      local_11 = false;
                      if ((fVar1 == pfVar2[2]) && (!NAN(fVar1) && !NAN(pfVar2[2]))) {
                        pfVar2 = mat4f::operator[](in_RDI,2);
                        fVar1 = pfVar2[3];
                        pfVar2 = mat4f::operator[](in_RSI,2);
                        local_11 = false;
                        if ((fVar1 == pfVar2[3]) && (!NAN(fVar1) && !NAN(pfVar2[3]))) {
                          pfVar2 = mat4f::operator[](in_RDI,3);
                          fVar1 = *pfVar2;
                          pfVar2 = mat4f::operator[](in_RSI,3);
                          local_11 = false;
                          if ((fVar1 == *pfVar2) && (!NAN(fVar1) && !NAN(*pfVar2))) {
                            pfVar2 = mat4f::operator[](in_RDI,3);
                            fVar1 = pfVar2[1];
                            pfVar2 = mat4f::operator[](in_RSI,3);
                            local_11 = false;
                            if ((fVar1 == pfVar2[1]) && (!NAN(fVar1) && !NAN(pfVar2[1]))) {
                              pfVar2 = mat4f::operator[](in_RDI,3);
                              fVar1 = pfVar2[2];
                              pfVar2 = mat4f::operator[](in_RSI,3);
                              local_11 = false;
                              if ((fVar1 == pfVar2[2]) && (!NAN(fVar1) && !NAN(pfVar2[2]))) {
                                pfVar2 = mat4f::operator[](in_RDI,3);
                                fVar1 = pfVar2[3];
                                pfVar2 = mat4f::operator[](in_RSI,3);
                                local_11 = fVar1 == pfVar2[3];
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

inline bool operator == (const mat4f& a, const mat4f& b) {
	return a[0][0]==b[0][0] &&
		a[0][1]==b[0][1] &&
		a[0][2]==b[0][2] &&
		a[0][3]==b[0][3] &&
		a[1][0]==b[1][0] &&
		a[1][1]==b[1][1] &&
		a[1][2]==b[1][2] &&
		a[1][3]==b[1][3] &&
		a[2][0]==b[2][0] &&
		a[2][1]==b[2][1] &&
		a[2][2]==b[2][2] &&
		a[2][3]==b[2][3] &&
		a[3][0]==b[3][0] &&
		a[3][1]==b[3][1] &&
		a[3][2]==b[3][2] &&
		a[3][3]==b[3][3];
}